

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O2

void beltWBLStepDOpt(void *buf,size_t count,void *state)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = *buf;
  *(ulong *)((long)state + 0x30) = uVar2;
  uVar3 = *(ulong *)((long)buf + 8);
  *(ulong *)((long)state + 0x38) = uVar3;
  for (uVar4 = 0x30; uVar4 < count; uVar4 = uVar4 + 0x10) {
    uVar2 = uVar2 ^ *(ulong *)((long)buf + (uVar4 - 0x20));
    *(ulong *)((long)state + 0x30) = uVar2;
    uVar3 = uVar3 ^ *(ulong *)((long)buf + (uVar4 - 0x18));
    *(ulong *)((long)state + 0x38) = uVar3;
  }
  uVar3 = count + 0xf >> 3 & 0xfffffffffffffffe;
  *(ulong *)((long)state + 0x40) = uVar3;
  uVar2 = count - 0x10;
  while (uVar3 != 0) {
    *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)buf + uVar2);
    *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)buf + uVar2 + 8);
    beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
    memXor2((octet *)((long)state + 0x20),(void *)((long)state + 0x40),8);
    uVar4 = ((count + uVar2) - 0x10) % count;
    *(ulong *)((long)buf + uVar4) = *(ulong *)((long)buf + uVar4) ^ *(ulong *)((long)state + 0x20);
    puVar1 = (ulong *)((long)buf + uVar4 + 8);
    *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x28);
    *(ulong *)((long)buf + uVar2) = *(ulong *)((long)buf + uVar2) ^ *(ulong *)((long)state + 0x30);
    puVar1 = (ulong *)((long)buf + uVar2 + 8);
    *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x38);
    uVar5 = ((count + uVar2) - 0x20) % count;
    uVar3 = *(ulong *)((long)state + 0x30) ^ *(ulong *)((long)buf + uVar5);
    *(ulong *)((long)state + 0x30) = uVar3;
    uVar5 = *(ulong *)((long)state + 0x38) ^ *(ulong *)((long)buf + uVar5 + 8);
    *(ulong *)((long)state + 0x38) = uVar5;
    *(ulong *)((long)state + 0x30) = uVar3 ^ *(ulong *)((long)buf + uVar2);
    *(ulong *)((long)state + 0x38) = uVar5 ^ *(ulong *)((long)buf + uVar2 + 8);
    uVar3 = *(long *)((long)state + 0x40) - 1;
    *(ulong *)((long)state + 0x40) = uVar3;
    uVar2 = uVar4;
  }
  return;
}

Assistant:

void beltWBLStepDOpt(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	size_t i;
	ASSERT(count >= 32 && count % 16 == 0);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	// sum <- r1 + ... + r_{n-2} (будущая сумма r2 + ... + r_{n-1})
	beltBlockCopy(st->sum, (octet*)buf);
	for (i = 16; i + 32 < count; i += 16)
		beltBlockXor2(st->sum, (octet*)buf + i);
	// 2 * n итераций (sum будет записываться по смещению i: 
	// это блок r* в начале такта и блок r1 в конце)
	for (st->round = 2 * n, i = count - 16; st->round; --st->round)
	{
		// block <- beltBlockEncr(r*) + <round>
		beltBlockCopy(st->block, (octet*)buf + i);
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + (i + count - 16) % count, st->block);
		// r1 <- pre r* + sum
		beltBlockXor2((octet*)buf + i, st->sum);
		// пересчитать sum: исключить старое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + (i + count - 32) % count);
		// пересчитать sum: добавить новое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + i);
		// назад
		i = (i + count - 16) % count;
	}
}